

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O2

CURLcode Curl_input_digest(Curl_easy *data,_Bool proxy,char *header)

{
  int iVar1;
  CURLcode CVar2;
  digestdata *digest;
  undefined7 in_register_00000031;
  char *local_20;
  
  digest = &(data->state).proxydigest;
  if ((int)CONCAT71(in_register_00000031,proxy) == 0) {
    digest = &(data->state).digest;
  }
  iVar1 = curl_strnequal(header,"Digest",6);
  CVar2 = CURLE_BAD_CONTENT_ENCODING;
  if ((iVar1 != 0) && ((header[6] == ' ' || (header[6] == '\t')))) {
    local_20 = header + 6;
    Curl_str_passblanks(&local_20);
    CVar2 = Curl_auth_decode_digest_http_message(local_20,digest);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_input_digest(struct Curl_easy *data,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header) || !ISBLANK(header[6]))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  Curl_str_passblanks(&header);

  return Curl_auth_decode_digest_http_message(header, digest);
}